

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint32_t seekWaveToData(FILE *waveFile,WaveFmt *fmt)

{
  byte extraout_AL;
  byte bVar1;
  long lVar2;
  uint unaff_EBP;
  char *format;
  long unaff_R12;
  ulong uVar3;
  char waveHeader [13];
  int local_40;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  int iStack_38;
  char cStack_34;
  
  iStack_38 = 0;
  cStack_34 = '\0';
  local_40 = 0;
  bStack_3c = 0;
  bStack_3b = 0;
  bStack_3a = 0;
  bStack_39 = 0;
  fread(&local_40,0xc,1,(FILE *)waveFile);
  uVar3 = (ulong)bStack_3c;
  bStack_3c = 0;
  if ((local_40 == 0x46464952) && (cStack_34 == '\0' && iStack_38 == 0x45564157)) {
    uVar3 = (ulong)bStack_39 << 0x18 | (ulong)bStack_3a << 0x10 | (ulong)bStack_3b << 8 | uVar3 + 8;
    lVar2 = ftell((FILE *)waveFile);
    if (lVar2 < (long)uVar3) {
      do {
        fread(&local_40,8,1,(FILE *)waveFile);
        unaff_R12 = ftell((FILE *)waveFile);
        unaff_EBP = CONCAT13(bStack_39,CONCAT12(bStack_3a,CONCAT11(bStack_3b,bStack_3c)));
        bStack_3c = 0;
        if (local_40 == 0x20746d66) {
          fread(fmt,0x10,1,(FILE *)waveFile);
          bVar1 = fmt->audio_format[1];
          if ((fmt->audio_format[0] == '\x01') && (bVar1 == 0)) {
            if ((fmt->bits_per_sample[0] & 7) == 0) goto LAB_00103588;
            die("only 8, 16, 24 bit audio supported (audio file is %d bits)");
            bVar1 = extraout_AL;
          }
          die("only PCM audio is supported (audio format is 0x%2x%2x)",(ulong)bVar1);
          goto LAB_001035fa;
        }
        if (local_40 == 0x61746164) goto LAB_001035b9;
LAB_00103588:
        unaff_R12 = unaff_R12 + (ulong)unaff_EBP;
        fseek((FILE *)waveFile,unaff_R12,0);
        lVar2 = ftell((FILE *)waveFile);
      } while (lVar2 < (long)uVar3);
    }
    format = "data chunk not found!";
  }
  else {
LAB_001035fa:
    format = "not a valid wave file";
  }
  die(format);
LAB_001035b9:
  printf("data chunk found at %ld\n",unaff_R12);
  return unaff_EBP;
}

Assistant:

uint32_t seekWaveToData(FILE* waveFile, struct WaveFmt *fmt){
	char waveHeader[13] = {0};
	uint32_t fileLength;
	long chunkStart;
	uint32_t chunkSize;

	fread(waveHeader, 12, 1, waveFile);
	fileLength = 8 + ((uint32_t)(uint8_t)waveHeader[4]) | 
		(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
		(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
		(((uint32_t)(uint8_t)waveHeader[7]) << 24);
	waveHeader[4] = 0;
	if(strcmp(&waveHeader[0], "RIFF") != 0 || strcmp(&waveHeader[8], "WAVE") != 0){
		die("not a valid wave file");
	}

	while(ftell(waveFile) < fileLength){
		fread(waveHeader, 8, 1, waveFile);
		chunkStart = ftell(waveFile);
		chunkSize = ((uint32_t)(uint8_t)waveHeader[4]) | 
			(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
			(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
			(((uint32_t)(uint8_t)waveHeader[7]) << 24);
		waveHeader[4] = 0;
		if(!strcmp(&waveHeader[0], "fmt ")){
			fread(fmt, 16, 1, waveFile);
			if(fmt->audio_format[0] != 1 || fmt->audio_format[1] != 0)
				die("only PCM audio is supported (audio format is 0x%2x%2x)", fmt->audio_format[1], fmt->audio_format[0]);
			if(fmt->bits_per_sample[0] % 8 != 0)
				die("only 8, 16, 24 bit audio supported (audio file is %d bits)", fmt->bits_per_sample[0]);
		}else if(!strcmp(&waveHeader[0], "data")){
			printf("data chunk found at %ld\n", chunkStart);
			return chunkSize;
		}
		fseek(waveFile, chunkStart + chunkSize, SEEK_SET);
	}

	die("data chunk not found!");
	return -1;
}